

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall resetOnEndTimeFixture::createSession(resetOnEndTimeFixture *this)

{
  UtcTimeOnly local_40;
  UtcTimeOnly local_28;
  resetOnEndTimeFixture *local_10;
  resetOnEndTimeFixture *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now);
  FIX::UtcTimeStamp::operator=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now);
  FIX::DateTime::setMillisecond
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
              super_DateTime,0);
  FIX::UtcTimeStamp::operator=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTimeStamp,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp);
  FIX::UtcTimeOnly::UtcTimeOnly
            (&local_28,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
              super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_28);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_28);
  FIX::UtcTimeOnly::UtcTimeOnly
            (&local_40,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
              super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime,
             &local_40);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_40);
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
              super_DateTime,2);
  anon_unknown.dwarf_2926b4::sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }